

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::Environment::bind<float>
          (Environment *this,Variable<float> *variable,IVal *value)

{
  deInt32 *pdVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uchar *puVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  _func_int **pp_Var10;
  mapped_type local_58;
  key_type local_40;
  
  pp_Var10 = (_func_int **)operator_new__(0x18);
  uVar6 = value->field_0x4;
  uVar7 = value->field_0x5;
  uVar8 = value->field_0x6;
  uVar9 = value->field_0x7;
  uVar3 = *(undefined4 *)&value->m_lo;
  uVar4 = *(undefined4 *)((long)&value->m_lo + 4);
  *(undefined4 *)pp_Var10 = *(undefined4 *)value;
  puVar5 = (uchar *)((long)pp_Var10 + 4);
  puVar5[0] = uVar6;
  puVar5[1] = uVar7;
  puVar5[2] = uVar8;
  puVar5[3] = uVar9;
  *(undefined4 *)(pp_Var10 + 1) = uVar3;
  *(undefined4 *)((long)pp_Var10 + 0xc) = uVar4;
  pp_Var10[2] = (_func_int *)value->m_hi;
  pcVar2 = (variable->m_name)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + (variable->m_name)._M_string_length);
  local_58.m_state = (SharedPtrStateBase *)0x0;
  local_58.m_ptr = (uchar *)pp_Var10;
  local_58.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_58.m_state)->strongRefCount = 0;
  (local_58.m_state)->weakRefCount = 0;
  (local_58.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d41fe8;
  local_58.m_state[1]._vptr_SharedPtrStateBase = pp_Var10;
  (local_58.m_state)->strongRefCount = 1;
  (local_58.m_state)->weakRefCount = 1;
  de::
  insert<std::map<std::__cxx11::string,de::SharedPtr<unsigned_char>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,de::SharedPtr<unsigned_char>>>>>
            (&this->m_map,&local_40,&local_58);
  if (local_58.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_58.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_58.m_ptr = (uchar *)0x0;
      (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_58.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_58.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_58.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void						bind	(const Variable<T>&					variable,
										 const typename Traits<T>::IVal&	value)
	{
		deUint8* const data = new deUint8[sizeof(value)];

		deMemcpy(data, &value, sizeof(value));
		de::insert(m_map, variable.getName(), SharedPtr<deUint8>(data, de::ArrayDeleter<deUint8>()));
	}